

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::StandardBufferManager::WriteTemporaryBuffer
          (StandardBufferManager *this,MemoryTag tag,block_id_t block_id,FileBuffer *buffer)

{
  idx_t iVar1;
  idx_t iVar2;
  pointer pTVar3;
  type pTVar4;
  FileSystem *pFVar5;
  pointer this_00;
  type handle;
  FileOpenFlags FVar6;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_50;
  string path;
  
  RequireTemporaryDirectory(this);
  iVar2 = buffer->internal_size;
  iVar1 = GetBlockAllocSize(this);
  if (iVar2 == iVar1) {
    iVar2 = GetBlockAllocSize(this);
    LOCK();
    this->evicted_data_per_tag[tag].super___atomic_base<unsigned_long>._M_i =
         this->evicted_data_per_tag[tag].super___atomic_base<unsigned_long>._M_i + iVar2;
    UNLOCK();
    pTVar3 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
             ::operator->(&(this->temporary_directory).handle);
    pTVar4 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
             ::operator*(&pTVar3->temp_file);
    TemporaryFileManager::WriteTemporaryBuffer(pTVar4,block_id,buffer);
    return;
  }
  GetTemporaryPath_abi_cxx11_(&path,this,block_id);
  LOCK();
  this->evicted_data_per_tag[tag].super___atomic_base<unsigned_long>._M_i =
       this->evicted_data_per_tag[tag].super___atomic_base<unsigned_long>._M_i +
       buffer->internal_size;
  UNLOCK();
  pFVar5 = FileSystem::GetFileSystem(this->db);
  FVar6.lock = NO_LOCK;
  FVar6.compression = UNCOMPRESSED;
  FVar6._10_6_ = 0;
  FVar6.flags = 8;
  FVar6 = FileOpenFlags::operator|((FileOpenFlags *)FileFlags::FILE_FLAGS_WRITE,FVar6);
  (*pFVar5->_vptr_FileSystem[2])(&local_50,pFVar5,&path,FVar6.flags,(ulong)FVar6._8_2_,0);
  pTVar3 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
           ::operator->(&(this->temporary_directory).handle);
  pTVar4 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
           ::operator*(&pTVar3->temp_file);
  TemporaryFileManager::IncreaseSizeOnDisk(pTVar4,buffer->internal_size + 8);
  this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
            operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)&local_50);
  FileHandle::Write(this_00,&buffer->size,8,0);
  handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)&local_50);
  FileBuffer::Write(buffer,handle,8);
  if (local_50._M_head_impl != (FileHandle *)0x0) {
    (*(local_50._M_head_impl)->_vptr_FileHandle[1])();
  }
  ::std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void StandardBufferManager::WriteTemporaryBuffer(MemoryTag tag, block_id_t block_id, FileBuffer &buffer) {

	// WriteTemporaryBuffer assumes that we never write a buffer below DEFAULT_BLOCK_ALLOC_SIZE.
	RequireTemporaryDirectory();

	// Append to a few grouped files.
	if (buffer.AllocSize() == GetBlockAllocSize()) {
		evicted_data_per_tag[uint8_t(tag)] += GetBlockAllocSize();
		temporary_directory.handle->GetTempFile().WriteTemporaryBuffer(block_id, buffer);
		return;
	}

	// Get the path to write to.
	auto path = GetTemporaryPath(block_id);
	evicted_data_per_tag[uint8_t(tag)] += buffer.AllocSize();

	// Create the file and write the size followed by the buffer contents.
	auto &fs = FileSystem::GetFileSystem(db);
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_FILE_CREATE);
	temporary_directory.handle->GetTempFile().IncreaseSizeOnDisk(buffer.AllocSize() + sizeof(idx_t));
	handle->Write(&buffer.size, sizeof(idx_t), 0);
	buffer.Write(*handle, sizeof(idx_t));
}